

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logmath.c
# Opt level: O0

logmath_t * logmath_init(float64 base,int shift,int use_table)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  double dVar5;
  double dVar6;
  uint local_60;
  uint32 prev;
  int32 k_1;
  float64 lobyx_1;
  int32 k;
  float64 lobyx;
  double dStack_38;
  int width;
  float64 byx;
  uint32 i;
  uint32 maxyx;
  logmath_t *lmath;
  int use_table_local;
  int shift_local;
  float64 base_local;
  
  if (1.0 < (double)base) {
    base_local = (float64)__ckd_calloc__(1,0x50,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/logmath.c"
                                         ,0x4d);
    *(undefined4 *)((long)base_local + 0x10) = 1;
    *(float64 *)((long)base_local + 0x20) = base;
    dVar5 = log((double)base);
    *(double *)((long)base_local + 0x28) = dVar5;
    dVar5 = log10((double)base);
    *(double *)((long)base_local + 0x30) = dVar5;
    *(double *)((long)base_local + 0x38) = 1.0 / *(double *)((long)base_local + 0x28);
    *(double *)((long)base_local + 0x40) = 1.0 / *(double *)((long)base_local + 0x30);
    bVar1 = (byte)shift;
    *(byte *)((long)base_local + 0xd) = bVar1;
    *(int *)((long)base_local + 0x48) = -0x80000000 >> (bVar1 + 2 & 0x1f);
    if (use_table != 0) {
      dVar5 = log(2.0);
      dVar6 = log((double)base);
      uVar2 = (uint)(long)(dVar5 / dVar6 + 0.5) >> (bVar1 & 0x1f);
      if (uVar2 < 0x100) {
        lobyx._4_4_ = 1;
      }
      else if (uVar2 < 0x10000) {
        lobyx._4_4_ = 2;
      }
      else {
        lobyx._4_4_ = 4;
      }
      *(char *)((long)base_local + 0xc) = (char)lobyx._4_4_;
      dStack_38 = 1.0;
      byx._0_4_ = 0;
      while (dVar5 = log(dStack_38 + 1.0),
            0 < (int)((double)(1 << (bVar1 & 0x1f)) * 0.5 +
                     dVar5 * *(double *)((long)base_local + 0x38)) >> (bVar1 & 0x1f)) {
        dStack_38 = dStack_38 / (double)base;
        byx._0_4_ = byx._0_4_ + 1;
      }
      byx._0_4_ = byx._0_4_ >> (bVar1 & 0x1f);
      if (byx._0_4_ < 0xff) {
        byx._0_4_ = 0xff;
      }
      pvVar4 = __ckd_calloc__((ulong)(byx._0_4_ + 1),(long)lobyx._4_4_,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/logmath.c"
                              ,0x77);
      *(void **)base_local = pvVar4;
      *(uint *)((long)base_local + 8) = byx._0_4_ + 1;
      dStack_38 = 1.0;
      byx._0_4_ = 0;
      while( true ) {
        dVar5 = log(dStack_38 + 1.0);
        iVar3 = (int)((double)(1 << (bVar1 & 0x1f)) * 0.5 +
                     dVar5 * *(double *)((long)base_local + 0x38)) >> (bVar1 & 0x1f);
        local_60 = 0;
        if (lobyx._4_4_ == 1) {
          local_60 = (uint)*(byte *)(*(long *)base_local + (ulong)(byx._0_4_ >> (bVar1 & 0x1f)));
        }
        else if (lobyx._4_4_ == 2) {
          local_60 = (uint)*(ushort *)
                            (*(long *)base_local + (ulong)(byx._0_4_ >> (bVar1 & 0x1f)) * 2);
        }
        else if (lobyx._4_4_ == 4) {
          local_60 = *(uint *)(*(long *)base_local + (ulong)(byx._0_4_ >> (bVar1 & 0x1f)) * 4);
        }
        if (local_60 == 0) {
          if (lobyx._4_4_ == 1) {
            *(char *)(*(long *)base_local + (ulong)(byx._0_4_ >> (bVar1 & 0x1f))) = (char)iVar3;
          }
          else if (lobyx._4_4_ == 2) {
            *(short *)(*(long *)base_local + (ulong)(byx._0_4_ >> (bVar1 & 0x1f)) * 2) =
                 (short)iVar3;
          }
          else if (lobyx._4_4_ == 4) {
            *(int *)(*(long *)base_local + (ulong)(byx._0_4_ >> (bVar1 & 0x1f)) * 4) = iVar3;
          }
        }
        if (iVar3 < 1) break;
        dStack_38 = dStack_38 / (double)base;
        byx._0_4_ = byx._0_4_ + 1;
      }
    }
  }
  else {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/logmath.c"
            ,0x48,"Base must be greater than 1.0\n");
    base_local = 0.0;
  }
  return (logmath_t *)base_local;
}

Assistant:

logmath_t *
logmath_init(float64 base, int shift, int use_table)
{
    logmath_t *lmath;
    uint32 maxyx, i;
    float64 byx;
    int width;

    /* Check that the base is correct. */
    if (base <= 1.0) {
        E_ERROR("Base must be greater than 1.0\n");
        return NULL;
    }
    
    /* Set up various necessary constants. */
    lmath = ckd_calloc(1, sizeof(*lmath));
    lmath->refcount = 1;
    lmath->base = base;
    lmath->log_of_base = log(base);
    lmath->log10_of_base = log10(base);
    lmath->inv_log_of_base = 1.0/lmath->log_of_base;
    lmath->inv_log10_of_base = 1.0/lmath->log10_of_base;
    lmath->t.shift = shift;
    /* Shift this sufficiently that overflows can be avoided. */
    lmath->zero = MAX_NEG_INT32 >> (shift + 2);

    if (!use_table)
        return lmath;

    /* Create a logadd table with the appropriate width */
    maxyx = (uint32) (log(2.0) / log(base) + 0.5) >> shift;
    /* Poor man's log2 */
    if (maxyx < 256) width = 1;
    else if (maxyx < 65536) width = 2;
    else width = 4;

    lmath->t.width = width;
    /* Figure out size of add table required. */
    byx = 1.0; /* Maximum possible base^{y-x} value - note that this implies that y-x == 0 */
    for (i = 0;; ++i) {
        float64 lobyx = log(1.0 + byx) * lmath->inv_log_of_base; /* log_{base}(1 + base^{y-x}); */
        int32 k = (int32) (lobyx + 0.5 * (1<<shift)) >> shift; /* Round to shift */

        /* base^{y-x} has reached the smallest representable value. */
        if (k <= 0)
            break;

        /* This table is indexed by -(y-x), so we multiply byx by
         * base^{-1} here which is equivalent to subtracting one from
         * (y-x). */
        byx /= base;
    }
    i >>= shift;

    /* Never produce a table smaller than 256 entries. */
    if (i < 255) i = 255;

    lmath->t.table = ckd_calloc(i+1, width);
    lmath->t.table_size = i + 1;
    /* Create the add table (see above). */
    byx = 1.0;
    for (i = 0;; ++i) {
        float64 lobyx = log(1.0 + byx) * lmath->inv_log_of_base;
        int32 k = (int32) (lobyx + 0.5 * (1<<shift)) >> shift; /* Round to shift */
        uint32 prev = 0;

        /* Check any previous value - if there is a shift, we want to
         * only store the highest one. */
        switch (width) {
        case 1:
            prev = ((uint8 *)lmath->t.table)[i >> shift];
            break;
        case 2:
            prev = ((uint16 *)lmath->t.table)[i >> shift];
            break;
        case 4:
            prev = ((uint32 *)lmath->t.table)[i >> shift];
            break;
        }
        if (prev == 0) {
            switch (width) {
            case 1:
                ((uint8 *)lmath->t.table)[i >> shift] = (uint8) k;
                break;
            case 2:
                ((uint16 *)lmath->t.table)[i >> shift] = (uint16) k;
                break;
            case 4:
                ((uint32 *)lmath->t.table)[i >> shift] = (uint32) k;
                break;
            }
        }
        if (k <= 0)
            break;

        /* Decay base^{y-x} exponentially according to base. */
        byx /= base;
    }

    return lmath;
}